

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

trt_keyword_stmt *
tro_modi_get_notifications(trt_keyword_stmt *__return_storage_ptr__,trt_tree_ctx *tc)

{
  void *pvVar1;
  lysc_node_notif *local_18;
  void *notifs;
  trt_tree_ctx *tc_local;
  
  if (tc != (trt_tree_ctx *)0x0) {
    memset(__return_storage_ptr__,0,0x18);
    if (tc->lysc_tree == '\0') {
      local_18 = (lysc_node_notif *)tc->pmod->notifs;
      if (local_18 != (lysc_node_notif *)0x0) {
        tc->pn = (lysp_node *)local_18;
        tc->tpn = tc->pn;
      }
    }
    else {
      local_18 = tc->cmod->notifs;
      if (local_18 != (lysc_node_notif *)0x0) {
        tc->cn = (lysc_node *)local_18;
      }
    }
    if (local_18 != (lysc_node_notif *)0x0) {
      tc->section = TRD_SECT_NOTIF;
      __return_storage_ptr__->section_name = "notifications";
      pvVar1 = tro_tree_ctx_get_node(tc);
      __return_storage_ptr__->has_node = pvVar1 != (void *)0x0;
    }
    return __return_storage_ptr__;
  }
  __assert_fail("tc",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_tree.c"
                ,0x9e8,"struct trt_keyword_stmt tro_modi_get_notifications(struct trt_tree_ctx *)");
}

Assistant:

static struct trt_keyword_stmt
tro_modi_get_notifications(struct trt_tree_ctx *tc)
{
    assert(tc);
    const void *notifs;
    struct trt_keyword_stmt ret = {0};

    if (tc->lysc_tree) {
        notifs = tc->cmod->notifs;
        if (notifs) {
            tc->cn = notifs;
        }
    } else {
        notifs = tc->pmod->notifs;
        if (notifs) {
            tc->pn = notifs;
            tc->tpn = tc->pn;
        }
    }

    if (notifs) {
        tc->section = TRD_SECT_NOTIF;
        ret.section_name = TRD_KEYWORD_NOTIF;
        ret.has_node = tro_tree_ctx_get_node(tc) ? 1 : 0;
    }

    return ret;
}